

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_MNI_ImportOtherNetworksFail_Test::TestBody
          (InterpreterTestSuite_MNI_ImportOtherNetworksFail_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  Registry *pRVar6;
  Status SVar7;
  bool bVar8;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_00;
  char *pcVar9;
  Status local_4ba;
  Status local_4b9;
  string local_4b8;
  internal local_498 [8];
  undefined8 *local_490;
  string local_488;
  Value value;
  string local_418;
  char *local_3f8;
  undefined1 local_3f0 [8];
  _Alloc_hider local_3e8;
  undefined1 local_3e0 [24];
  _Alloc_hider local_3c8;
  char local_3b8 [16];
  string local_3a8;
  ByteArray local_388;
  ByteArray local_368;
  string local_350;
  string local_330;
  State local_30c;
  State local_308;
  State local_304;
  UnixTime local_300;
  UnixTime local_2f8;
  UnixTime local_2f0;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  value.mError.mCode = kNone;
  value.mError._4_4_ = 0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&br,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&value);
  if ((char)br._vptr_BorderRouter == '\0') {
    testing::Message::Message((Message *)&value);
    if ((undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId) == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)CONCAT44(br.mNetworkId.mId,br.mId.mId);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xb42,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
    local_490 = (undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId);
    if (local_490 == (undefined8 *)0x0) goto LAB_0019dfa5;
    if ((undefined8 *)*local_490 != local_490 + 2) {
      operator_delete((undefined8 *)*local_490);
    }
  }
  else {
    puVar3 = (undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId);
    if (puVar3 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar3 != puVar3 + 2) {
        operator_delete((undefined8 *)*puVar3);
      }
      operator_delete(puVar3);
    }
    pRVar6 = ctx.mRegistry;
    value.mError._0_8_ = &value.mError.mMessage._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.1","");
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3f0 = (undefined1  [8])local_3e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_304,0,0,0,0,0);
    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"net1","");
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"");
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
    local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"domain1","");
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    pcVar9 = "";
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"","");
    ot::commissioner::UnixTime::UnixTime(&local_2f0,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&br,(string *)&value,0x4e21,&local_368,(string *)local_3f0,local_304,
               &local_4b8,2,&local_488,&local_418,(Timestamp)0x0,0,&local_3a8,&local_388,&local_330,
               '\0',0,&local_350,local_2f0,0x101f);
    local_4b9 = ot::commissioner::persistent_storage::Registry::Add(pRVar6,(BorderAgent *)&br);
    local_4ba = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              (local_498,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_4b9,&local_4ba);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if (local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p);
    }
    if (local_3f0 != (undefined1  [8])local_3e0) {
      operator_delete((void *)local_3f0);
    }
    if (local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
      operator_delete((void *)value.mError._0_8_);
    }
    puVar3 = local_490;
    if (local_498[0] == (internal)0x0) {
      testing::Message::Message((Message *)&br);
      if (local_490 != (undefined8 *)0x0) {
        pcVar9 = (char *)*local_490;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xb46,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if (br._vptr_BorderRouter != (_func_int **)0x0) {
        (**(code **)(*br._vptr_BorderRouter + 8))();
      }
      if (local_490 == (undefined8 *)0x0) goto LAB_0019dfa5;
      if ((undefined8 *)*local_490 != local_490 + 2) {
        operator_delete((undefined8 *)*local_490);
      }
    }
    else {
      if (local_490 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_490 != local_490 + 2) {
          operator_delete((undefined8 *)*local_490);
        }
        operator_delete(puVar3);
      }
      pRVar6 = ctx.mRegistry;
      value.mError._0_8_ = &value.mError.mMessage._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.2","");
      local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3f0 = (undefined1  [8])local_3e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"1.1","");
      ot::commissioner::BorderAgent::State::State(&local_308,0,0,0,0,0);
      local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"net2","");
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"");
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
      local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"domain2","");
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      local_3f8 = "";
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_350);
      ot::commissioner::UnixTime::UnixTime(&local_2f8,0);
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&br,(string *)&value,0x4e22,&local_368,(string *)local_3f0,local_308
                 ,&local_4b8,1,&local_488,&local_418,(Timestamp)0x0,0,&local_3a8,&local_388,
                 &local_330,'\0',0,&local_350,local_2f8,0x101f);
      local_4b9 = ot::commissioner::persistent_storage::Registry::Add(pRVar6,(BorderAgent *)&br);
      local_4ba = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                (local_498,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_4b9,&local_4ba);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      if (local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p);
      }
      if (local_3f0 != (undefined1  [8])local_3e0) {
        operator_delete((void *)local_3f0);
      }
      if (local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
        operator_delete((void *)value.mError._0_8_);
      }
      puVar3 = local_490;
      if (local_498[0] == (internal)0x0) {
        testing::Message::Message((Message *)&br);
        if (local_490 != (undefined8 *)0x0) {
          local_3f8 = (char *)*local_490;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&value,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xb4a,local_3f8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
        if (br._vptr_BorderRouter != (_func_int **)0x0) {
          (**(code **)(*br._vptr_BorderRouter + 8))();
        }
        if (local_490 == (undefined8 *)0x0) goto LAB_0019dfa5;
        if ((undefined8 *)*local_490 != local_490 + 2) {
          operator_delete((undefined8 *)*local_490);
        }
      }
      else {
        if (local_490 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_490 != local_490 + 2) {
            operator_delete((undefined8 *)*local_490);
          }
          operator_delete(puVar3);
        }
        pRVar6 = ctx.mRegistry;
        value.mError._0_8_ = &value.mError.mMessage._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.3","");
        local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3f0 = (undefined1  [8])local_3e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"1.1","");
        ot::commissioner::BorderAgent::State::State(&local_30c,0,0,0,0,0);
        local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"net2","");
        local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"");
        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
        local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"domain2","");
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        local_3f8 = "";
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_350);
        ot::commissioner::UnixTime::UnixTime(&local_300,0);
        pcVar9 = (char *)(ulong)(uint)local_30c;
        ot::commissioner::BorderAgent::BorderAgent
                  ((BorderAgent *)&br,(string *)&value,0x4e23,&local_368,(string *)local_3f0,
                   local_30c,&local_4b8,1,&local_488,&local_418,(Timestamp)0x0,0,&local_3a8,
                   &local_388,&local_330,'\0',0,&local_350,local_300,0x101f);
        local_4b9 = ot::commissioner::persistent_storage::Registry::Add(pRVar6,(BorderAgent *)&br);
        local_4ba = kSuccess;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  (local_498,
                   "ctx.mRegistry->Add(BorderAgent{\"127.0.0.3\", 20003, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                   ,"RegistryStatus::kSuccess",&local_4b9,&local_4ba);
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p);
        }
        if (local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_388.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p != &local_488.field_2) {
          operator_delete(local_488._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
          operator_delete(local_4b8._M_dataplus._M_p);
        }
        if (local_3f0 != (undefined1  [8])local_3e0) {
          operator_delete((void *)local_3f0);
        }
        if (local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_368.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
          operator_delete((void *)value.mError._0_8_);
        }
        if (local_498[0] != (internal)0x0) {
          if (local_490 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_490 != local_490 + 2) {
              operator_delete((undefined8 *)*local_490);
            }
            operator_delete(local_490);
          }
          ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
          ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&value,0);
          br.mNetworkId.mId = value.mError.mCode;
          SVar7 = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork
                            (ctx.mRegistry,&br);
          local_3f0[0] = SVar7;
          local_4b8._M_dataplus._M_p = local_4b8._M_dataplus._M_p & 0xffffffffffffff00;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)&value,"ctx.mRegistry->SetCurrentNetwork(br)",
                     "RegistryStatus::kSuccess",local_3f0,(Status *)&local_4b8);
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)local_3f0);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xb52,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4b8,(Message *)local_3f0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4b8);
            if (local_3f0 != (undefined1  [8])0x0) {
              (**(code **)&(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_3f0)->
                           _M_use_count)();
            }
            _Var5._M_p = value.mError.mMessage._M_dataplus._M_p;
            if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
              if (*value.mError.mMessage._M_dataplus._M_p !=
                  value.mError.mMessage._M_dataplus._M_p + 0x10) {
                operator_delete(*value.mError.mMessage._M_dataplus._M_p);
              }
              operator_delete(_Var5._M_p);
            }
          }
          else {
            if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
              if (*value.mError.mMessage._M_dataplus._M_p !=
                  value.mError.mMessage._M_dataplus._M_p + 0x10) {
                operator_delete(*value.mError.mMessage._M_dataplus._M_p);
              }
              operator_delete(value.mError.mMessage._M_dataplus._M_p);
            }
            local_3e8._M_p = (pointer)operator_new(8);
            (((MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
             local_3e8._M_p)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                 (_func_int **)&PTR__MatcherDescriberInterface_0039a928;
            local_3f0 = (undefined1  [8])&PTR__MatcherBase_00395d20;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>&>const*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_3e0,
                       (MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                       local_3e8._M_p);
            local_3f0 = (undefined1  [8])&PTR__MatcherBase_00395cd8;
            local_4b8._M_string_length = (size_type)operator_new(8);
            (((MatcherInterface<const_ot::commissioner::Config_&> *)local_4b8._M_string_length)->
            super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                 (_func_int **)&PTR__MatcherDescriberInterface_0039a9e0;
            local_4b8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d88;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<testing::MatcherInterface<ot::commissioner::Config_const&>const*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_4b8.field_2._M_allocated_capacity,
                       (MatcherInterface<const_ot::commissioner::Config_&> *)
                       local_4b8._M_string_length);
            local_4b8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d40;
            CommissionerAppStaticExpecter::gmock_Create
                      ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                        *)&value,&ctx.mCommissionerAppStaticExpecter,
                       (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)local_3f0,
                       (Matcher<const_ot::commissioner::Config_&> *)&local_4b8);
            testing::internal::GetWithoutMatchers();
            this_00 = testing::internal::
                      MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                      ::InternalExpectedAt
                                ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                  *)&value,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                                 ,0xb54,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
            testing::internal::
            TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
            ::Times(this_00,0);
            value.mError.mMessage.field_2._8_8_ = &PTR__MatcherBase_00395d20;
            if (value.mData._M_string_length != 0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         value.mData._M_string_length);
            }
            value.mError.mMessage._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d88;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                         value.mError.mMessage.field_2._M_local_buf[0]) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                                  value.mError.mMessage.field_2._M_local_buf[0]));
            }
            local_4b8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d88;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_4b8.field_2._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_4b8.field_2._M_allocated_capacity);
            }
            local_3f0 = (undefined1  [8])&PTR__MatcherBase_00395d20;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e0._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e0._0_8_);
            }
            local_488.field_2._M_allocated_capacity = 0;
            local_488._M_dataplus._M_p = (pointer)0x0;
            local_488._M_string_length = 0;
            paVar1 = &value.mError.mMessage.field_2;
            value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
            value.mError.mMessage._M_string_length = 0;
            value.mError.mMessage.field_2._M_local_buf[0] = '\0';
            paVar2 = &value.mData.field_2;
            value.mData._M_string_length = 0;
            value.mData.field_2._M_local_buf[0] = '\0';
            value.mError.mMessage._M_dataplus._M_p = (pointer)paVar1;
            value.mData._M_dataplus._M_p = (pointer)paVar2;
            local_3f0 = (undefined1  [8])local_3e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3f0,"opdataset set active --nwk other --import absent.json",
                       "");
            ot::commissioner::Interpreter::ParseExpression
                      ((Expression *)&local_418,&ctx.mInterpreter,(string *)local_3f0);
            local_4b8.field_2._M_allocated_capacity = local_488.field_2._M_allocated_capacity;
            local_4b8._M_string_length = local_488._M_string_length;
            local_4b8._M_dataplus._M_p = local_488._M_dataplus._M_p;
            local_488.field_2._M_allocated_capacity = local_418.field_2._M_allocated_capacity;
            local_488._M_dataplus._M_p = local_418._M_dataplus._M_p;
            local_488._M_string_length = local_418._M_string_length;
            local_418._M_dataplus._M_p = (pointer)0x0;
            local_418._M_string_length = 0;
            local_418.field_2._M_allocated_capacity = 0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_4b8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_418);
            if (local_3f0 != (undefined1  [8])local_3e0) {
              operator_delete((void *)local_3f0);
            }
            ot::commissioner::Interpreter::Eval
                      ((Value *)local_3f0,&ctx.mInterpreter,(Expression *)&local_488);
            value.mError.mCode = local_3f0._0_4_;
            std::__cxx11::string::operator=((string *)&value.mError.mMessage,(string *)&local_3e8);
            std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_3c8);
            if (local_3c8._M_p != local_3b8) {
              operator_delete(local_3c8._M_p);
            }
            if ((MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                local_3e8._M_p !=
                (MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                (local_3e0 + 8)) {
              operator_delete(local_3e8._M_p);
            }
            bVar8 = ot::commissioner::Interpreter::Value::HasNoError(&value);
            local_4b8._M_dataplus._M_p._0_1_ = !bVar8;
            local_4b8._M_string_length = 0;
            if (bVar8) {
              testing::Message::Message((Message *)&local_418);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_3f0,(internal *)&local_4b8,(AssertionResult *)0x2ddeee,
                         "true","false",pcVar9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_3a8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                         ,0xb5b,(char *)local_3f0);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_3a8,(Message *)&local_418);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
              if (local_3f0 != (undefined1  [8])local_3e0) {
                operator_delete((void *)local_3f0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)local_418._M_dataplus._M_p + 8))();
              }
              sVar4 = local_4b8._M_string_length;
              if ((undefined8 *)local_4b8._M_string_length != (undefined8 *)0x0) {
                if (*(undefined8 **)local_4b8._M_string_length !=
                    (undefined8 *)(local_4b8._M_string_length + 0x10)) {
                  operator_delete(*(undefined8 **)local_4b8._M_string_length);
                }
                operator_delete((void *)sVar4);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)value.mData._M_dataplus._M_p != paVar2) {
              operator_delete(value.mData._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)value.mError.mMessage._M_dataplus._M_p != paVar1) {
              operator_delete(value.mError.mMessage._M_dataplus._M_p);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_488);
          }
          br._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_00395f58;
          ot::commissioner::BorderAgent::~BorderAgent(&br.mAgent);
          goto LAB_0019dfa5;
        }
        testing::Message::Message((Message *)&br);
        if (local_490 != (undefined8 *)0x0) {
          local_3f8 = (char *)*local_490;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&value,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xb4e,local_3f8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
        if (br._vptr_BorderRouter != (_func_int **)0x0) {
          (**(code **)(*br._vptr_BorderRouter + 8))();
        }
        if (local_490 == (undefined8 *)0x0) goto LAB_0019dfa5;
        if ((undefined8 *)*local_490 != local_490 + 2) {
          operator_delete((undefined8 *)*local_490);
        }
      }
    }
  }
  operator_delete(local_490);
LAB_0019dfa5:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNI_ImportOtherNetworksFail)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.3", 20003, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _)).Times(0);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("opdataset set active --nwk other --import absent.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());
}